

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_List_nodeid(int *nlist,int nprocs)

{
  long num_procs;
  Integer *list_00;
  int in_ESI;
  long in_RDI;
  Integer *list;
  Integer procs;
  Integer i;
  long local_18;
  
  num_procs = (long)in_ESI;
  list_00 = (Integer *)malloc(num_procs << 2);
  pnga_list_nodeid(list_00,num_procs);
  for (local_18 = 0; local_18 < num_procs; local_18 = local_18 + 1) {
    *(int *)(in_RDI + local_18 * 4) = (int)list_00[local_18];
  }
  free(list_00);
  return;
}

Assistant:

void GA_List_nodeid(int *nlist, int nprocs)
{
  Integer i, procs;
  Integer *list;
  procs = (Integer)(nprocs);
  list = malloc(procs*sizeof(int));
  wnga_list_nodeid(list, procs);
  for (i=0; i<procs; i++) {
    nlist[i] = (int)list[i];
  }
  free(list);
}